

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singular.hpp
# Opt level: O3

bool mserialize::detail::singular_impl(string_view full_tag,string_view tag,int max_recursion)

{
  detail *pdVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *this;
  size_t sVar4;
  char *pcVar5;
  detail *this_00;
  detail *this_01;
  char *pcVar6;
  string_view tag_00;
  string_view tags;
  string_view tags_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX;
  
  sVar4 = tag._len;
  tags._len = tag._ptr;
  if (max_recursion == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,full_tag._ptr,full_tag._ptr + full_tag._len);
    std::operator+(&local_50,"Recursion limit exceeded while visiting tag: ",&local_70);
    std::runtime_error::runtime_error(this,(string *)&local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = true;
  if (sVar4 != 0) {
    if (*tags._len == '{') {
      bVar2 = singular_struct(full_tag,tag,max_recursion + -1);
      return bVar2;
    }
    if (*tags._len == '(') {
      this_01 = (detail *)(tags._len + 1);
      pcVar6 = (char *)0x0;
      if (sVar4 != 1) {
        pcVar6 = (char *)(sVar4 - 2);
      }
      tags._ptr = pcVar6;
      pcVar3 = (char *)tag_first_size(this_01,tags);
      if (pcVar3 != (char *)0x0) {
        pcVar5 = pcVar3;
        if (pcVar6 < pcVar3) {
          pcVar5 = pcVar6;
        }
        pcVar6 = pcVar6 + -(long)pcVar5;
        pdVar1 = (detail *)(pcVar5 + (long)this_01);
        do {
          this_00 = pdVar1;
          tag_00._len = (size_t)pcVar3;
          tag_00._ptr = (char *)this_01;
          bVar2 = singular_impl(full_tag,tag_00,max_recursion + -1);
          if (!bVar2) {
            return bVar2;
          }
          tags_00._len = extraout_RDX;
          tags_00._ptr = pcVar6;
          pcVar3 = (char *)tag_first_size(this_00,tags_00);
          pcVar5 = pcVar3;
          if (pcVar6 < pcVar3) {
            pcVar5 = pcVar6;
          }
          pcVar6 = pcVar6 + -(long)pcVar5;
          pdVar1 = this_00 + (long)pcVar5;
          this_01 = this_00;
        } while (pcVar3 != (char *)0x0);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

inline bool singular_impl(string_view full_tag, string_view tag, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return true; }

  switch (tag.front())
  {
  case '(':
    return singular_tuple(full_tag, tag, max_recursion - 1);
  case '{':
    return singular_struct(full_tag, tag, max_recursion - 1);
  }

  return false;
}